

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
jessilib::simple_append<wchar_t,wchar_t>
          (jessilib *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *out_string,
          u8string_view in_string)

{
  const_iterator __first;
  const_iterator __last;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *out_string_local;
  u8string_view in_string_local;
  
  in_string_local._M_len = in_string._M_len;
  out_string_local = out_string;
  __first = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::begin
                      ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&out_string_local);
  __last = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::end
                     ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&out_string_local);
  std::__cxx11::wstring::append<char8_t_const*,void>((wstring *)this,__first,__last);
  return;
}

Assistant:

void simple_append(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	if constexpr (sizeof(OutCharT) == sizeof(ResultCharT)) {
		out_string.append(in_string.begin(), in_string.end());
	}
	else if constexpr (std::is_same_v<ResultCharT, char>) {
		// Copy in_string into result _as if_ result were of OutCharT
		for (OutCharT codepoint : in_string) {
			// TODO: Assuming native for now, but we need to account for endianness later
			out_string.append(reinterpret_cast<const char*>(&codepoint), sizeof(codepoint));
		}
	}
	// else // Invalid use of simple_append
}